

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O1

void fwd_txfm_transpose_8x8_avx2(__m256i *in,__m256i *out,int instride,int outstride)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  __m256i alVar11;
  __m256i alVar12;
  __m256i alVar13;
  __m256i alVar14;
  
  auVar7 = vunpcklps_avx((undefined1  [32])*in,(undefined1  [32])in[(uint)instride]);
  auVar1 = vunpckhps_avx((undefined1  [32])*in,(undefined1  [32])in[(uint)instride]);
  auVar8 = vunpcklps_avx((undefined1  [32])in[(uint)(instride * 2)],
                         (undefined1  [32])in[(uint)(instride * 3)]);
  auVar2 = vunpckhps_avx((undefined1  [32])in[(uint)(instride * 2)],
                         (undefined1  [32])in[(uint)(instride * 3)]);
  auVar9 = vunpcklps_avx((undefined1  [32])in[(uint)(instride * 4)],
                         (undefined1  [32])in[(uint)(instride * 5)]);
  auVar3 = vunpckhps_avx((undefined1  [32])in[(uint)(instride * 4)],
                         (undefined1  [32])in[(uint)(instride * 5)]);
  auVar10 = vunpcklps_avx((undefined1  [32])in[(uint)(instride * 6)],
                          (undefined1  [32])in[(uint)(instride * 7)]);
  auVar4 = vunpckhps_avx((undefined1  [32])in[(uint)(instride * 6)],
                         (undefined1  [32])in[(uint)(instride * 7)]);
  auVar5 = vunpcklpd_avx(auVar7,auVar8);
  auVar6 = vunpcklpd_avx(auVar9,auVar10);
  alVar14[2] = SUB168(auVar6._0_16_,0);
  alVar14[3] = SUB168(auVar6._0_16_,8);
  alVar14[0] = SUB168(auVar5._0_16_,0);
  alVar14[1] = SUB168(auVar5._0_16_,8);
  *out = alVar14;
  alVar11 = (__m256i)vperm2f128_avx(auVar5,auVar6,0x31);
  out[(uint)(outstride * 4)] = alVar11;
  auVar5 = vunpckhpd_avx(auVar7,auVar8);
  auVar6 = vunpckhpd_avx(auVar9,auVar10);
  alVar12[2] = SUB168(auVar6._0_16_,0);
  alVar12[3] = SUB168(auVar6._0_16_,8);
  alVar12[0] = SUB168(auVar5._0_16_,0);
  alVar12[1] = SUB168(auVar5._0_16_,8);
  out[(uint)outstride] = alVar12;
  alVar11 = (__m256i)vperm2f128_avx(auVar5,auVar6,0x31);
  out[(uint)(outstride * 5)] = alVar11;
  auVar5 = vunpcklpd_avx(auVar1,auVar2);
  auVar6 = vunpcklpd_avx(auVar3,auVar4);
  alVar13[2] = SUB168(auVar6._0_16_,0);
  alVar13[3] = SUB168(auVar6._0_16_,8);
  alVar13[0] = SUB168(auVar5._0_16_,0);
  alVar13[1] = SUB168(auVar5._0_16_,8);
  out[(uint)(outstride * 2)] = alVar13;
  alVar11 = (__m256i)vperm2f128_avx(auVar5,auVar6,0x31);
  out[(uint)(outstride * 6)] = alVar11;
  auVar5 = vunpckhpd_avx(auVar1,auVar2);
  auVar6 = vunpckhpd_avx(auVar3,auVar4);
  alVar11[2] = SUB168(auVar6._0_16_,0);
  alVar11[3] = SUB168(auVar6._0_16_,8);
  alVar11[0] = SUB168(auVar5._0_16_,0);
  alVar11[1] = SUB168(auVar5._0_16_,8);
  out[(uint)(outstride * 3)] = alVar11;
  alVar11 = (__m256i)vperm2f128_avx(auVar5,auVar6,0x31);
  out[(uint)(outstride * 7)] = alVar11;
  return;
}

Assistant:

static void fwd_txfm_transpose_8x8_avx2(const __m256i *in, __m256i *out,
                                        const int instride,
                                        const int outstride) {
  __m256i u0, u1, u2, u3, u4, u5, u6, u7;
  __m256i x0, x1;

  u0 = _mm256_unpacklo_epi32(in[0 * instride], in[1 * instride]);
  u1 = _mm256_unpackhi_epi32(in[0 * instride], in[1 * instride]);

  u2 = _mm256_unpacklo_epi32(in[2 * instride], in[3 * instride]);
  u3 = _mm256_unpackhi_epi32(in[2 * instride], in[3 * instride]);

  u4 = _mm256_unpacklo_epi32(in[4 * instride], in[5 * instride]);
  u5 = _mm256_unpackhi_epi32(in[4 * instride], in[5 * instride]);

  u6 = _mm256_unpacklo_epi32(in[6 * instride], in[7 * instride]);
  u7 = _mm256_unpackhi_epi32(in[6 * instride], in[7 * instride]);

  x0 = _mm256_unpacklo_epi64(u0, u2);
  x1 = _mm256_unpacklo_epi64(u4, u6);
  out[0 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x20);
  out[4 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x31);

  x0 = _mm256_unpackhi_epi64(u0, u2);
  x1 = _mm256_unpackhi_epi64(u4, u6);
  out[1 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x20);
  out[5 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x31);

  x0 = _mm256_unpacklo_epi64(u1, u3);
  x1 = _mm256_unpacklo_epi64(u5, u7);
  out[2 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x20);
  out[6 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x31);

  x0 = _mm256_unpackhi_epi64(u1, u3);
  x1 = _mm256_unpackhi_epi64(u5, u7);
  out[3 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x20);
  out[7 * outstride] = _mm256_permute2f128_si256(x0, x1, 0x31);
}